

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_false>::StartListValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_false> *this,idx_t row_idx)

{
  timestamp_t tVar1;
  
  if (*(long *)(this->args + 8) - *(long *)this->args != 0x68) {
    if (**(long **)&this->field_0x8 != 0) {
      row_idx = (idx_t)*(uint *)(**(long **)&this->field_0x8 + row_idx * 4);
    }
    return (TYPE)*(int64_t *)(*(long *)&this->field_0x10 + row_idx * 8);
  }
  tVar1 = TimestampRangeInfo::DefaultStart();
  return (TYPE)tVar1.value;
}

Assistant:

typename OP::TYPE StartListValue(idx_t row_idx) {
		if (args.ColumnCount() == 1) {
			return OP::DefaultStart();
		} else {
			auto data = (typename OP::TYPE *)vdata[0].data;
			auto idx = vdata[0].sel->get_index(row_idx);
			return data[idx];
		}
	}